

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parameter.h
# Opt level: O1

bool __thiscall Parameter::create(Parameter *this,int argc,char **argv)

{
  pointer pcVar1;
  char *pcVar2;
  typed_value<int,_char> *ptVar3;
  typed_value<double,_char> *ptVar4;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar5;
  typed_value<bool,_char> *ptVar6;
  const_iterator cVar7;
  ostream *poVar8;
  variables_map vm;
  options_description desc;
  bool local_1d2;
  bool local_1d1;
  basic_parsed_options<char> local_1d0;
  int local_1a4 [5];
  pointer local_190;
  pointer local_188;
  pointer local_180;
  undefined1 local_178 [24];
  _Rb_tree_node_base local_160;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_138 [48];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_108;
  undefined1 *local_d8 [2];
  undefined1 local_c8 [24];
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  local_b0 [24];
  void *local_98;
  undefined4 local_90;
  undefined8 local_88;
  undefined4 local_80;
  undefined8 local_78;
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  local_70 [24];
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_58;
  
  pcVar1 = local_178 + 0x10;
  local_178._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"Allowed options","");
  boost::program_options::options_description::options_description
            ((options_description *)local_d8,(string *)local_178,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  if ((pointer)local_178._0_8_ != pcVar1) {
    operator_delete((void *)local_178._0_8_);
  }
  local_180 = (pointer)boost::program_options::options_description::add_options();
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)&local_180,"help");
  ptVar3 = boost::program_options::value<int>(&this->k);
  local_1a4[4] = 10;
  ptVar3 = boost::program_options::typed_value<int,_char>::default_value(ptVar3,local_1a4 + 4);
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,(value_semantic *)0x134821,(char *)ptVar3);
  ptVar4 = boost::program_options::value<double>(&this->lambda);
  local_188 = (pointer)0x3fa999999999999a;
  ptVar4 = boost::program_options::typed_value<double,_char>::default_value
                     (ptVar4,(double *)&local_188);
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,(value_semantic *)"lambda",(char *)ptVar4);
  ptVar4 = boost::program_options::value<double>(&this->eps);
  local_190 = (pointer)0x3f50624dd2f1a9fc;
  ptVar4 = boost::program_options::typed_value<double,_char>::default_value
                     (ptVar4,(double *)&local_190);
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,(value_semantic *)0x1342f3,(char *)ptVar4);
  ptVar3 = boost::program_options::value<int>(&this->max_iter);
  local_1a4[3] = 5;
  ptVar3 = boost::program_options::typed_value<int,_char>::default_value(ptVar3,local_1a4 + 3);
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,(value_semantic *)"max_iter",(char *)ptVar3);
  ptVar3 = boost::program_options::value<int>(&this->max_inner_iter);
  local_1a4[2] = 5;
  ptVar3 = boost::program_options::typed_value<int,_char>::default_value(ptVar3,local_1a4 + 2);
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,(value_semantic *)"max_inner_iter",(char *)ptVar3);
  ptVar3 = boost::program_options::value<int>(&this->num_of_machine);
  local_1a4[1] = 1;
  ptVar3 = boost::program_options::typed_value<int,_char>::default_value(ptVar3,local_1a4 + 1);
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,(value_semantic *)"node",(char *)ptVar3);
  ptVar3 = boost::program_options::value<int>(&this->num_of_thread);
  local_1a4[0] = 4;
  ptVar3 = boost::program_options::typed_value<int,_char>::default_value(ptVar3,local_1a4);
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,(value_semantic *)"thread",(char *)ptVar3);
  ptVar5 = boost::program_options::value<std::__cxx11::string>(&this->meta_path);
  local_178._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"../data/netflix/","");
  ptVar5 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::default_value(ptVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_178);
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,(value_semantic *)"data_folder",(char *)ptVar5);
  ptVar5 = boost::program_options::value<std::__cxx11::string>(&this->output_path);
  local_1d0.options.
  super__Vector_base<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)((long)&local_1d0.options.
                        super__Vector_base<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
                + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"../output/netflix/","");
  ptVar5 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::default_value(ptVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&local_1d0);
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,(value_semantic *)"output_folder",(char *)ptVar5);
  ptVar6 = boost::program_options::value<bool>(&this->output);
  local_1d1 = true;
  ptVar6 = boost::program_options::typed_value<bool,_char>::default_value(ptVar6,&local_1d1);
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,(value_semantic *)"output",(char *)ptVar6);
  ptVar6 = boost::program_options::value<bool>(&this->verbose);
  local_1d2 = true;
  ptVar6 = boost::program_options::typed_value<bool,_char>::default_value(ptVar6,&local_1d2);
  boost::program_options::options_description_easy_init::operator()
            (pcVar2,(value_semantic *)"verbose",(char *)ptVar6);
  if (local_1d0.options.
      super__Vector_base<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pointer)((long)&local_1d0.options.
                       super__Vector_base<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
               + 0x10U)) {
    operator_delete(local_1d0.options.
                    super__Vector_base<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((pointer)local_178._0_8_ != pcVar1) {
    operator_delete((void *)local_178._0_8_);
  }
  boost::program_options::variables_map::variables_map((variables_map *)local_178);
  local_58.super_function_base.vtable = (vtable_base *)0x0;
  local_58.super_function_base.functor.members.obj_ptr = (obj_ptr_t)0x0;
  local_58.super_function_base.functor._8_8_ = 0;
  local_58.super_function_base.functor._16_8_ = 0;
  boost::program_options::parse_command_line<char>
            (&local_1d0,argc,argv,(options_description *)local_d8,0,&local_58);
  boost::program_options::store((basic_parsed_options *)&local_1d0,(variables_map *)local_178,false)
  ;
  std::
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ::~vector(&local_1d0.options);
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function1(&local_58);
  boost::program_options::notify((variables_map *)local_178);
  local_1d0.options.
  super__Vector_base<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)((long)&local_1d0.options.
                        super__Vector_base<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
                + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"help","");
  cVar7 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                  *)(local_178 + 0x10),(key_type *)&local_1d0);
  if (local_1d0.options.
      super__Vector_base<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pointer)((long)&local_1d0.options.
                       super__Vector_base<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
               + 0x10U)) {
    operator_delete(local_1d0.options.
                    super__Vector_base<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (cVar7._M_node != &local_160) {
    poVar8 = (ostream *)
             boost::program_options::operator<<
                       ((ostream *)&std::cout,(options_description *)local_d8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
  }
  local_178._0_8_ = std::logic_error::logic_error;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_108);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(local_138);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
               *)(local_178 + 0x10));
  std::
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  ::~vector(local_70);
  if (local_98 != (void *)0x0) {
    operator_delete(local_98);
    local_98 = (void *)0x0;
    local_90 = 0;
    local_88 = 0;
    local_80 = 0;
    local_78 = 0;
  }
  std::
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  ::~vector(local_b0);
  if (local_d8[0] != local_c8) {
    operator_delete(local_d8[0]);
  }
  return cVar7._M_node == &local_160;
}

Assistant:

bool create(int argc, char **argv) {

        po::options_description desc("Allowed options");
        desc.add_options()
                ("help", "produce help message")
                ("k", po::value<int>(&(Parameter::k))->default_value(10), "dimensionality of latent vector")
                ("lambda", po::value<value_type>(&(Parameter::lambda))->default_value(0.05), "regularization weight")
                ("epsilon", po::value<value_type>(&(Parameter::eps))->default_value(1e-3), "inner termination criterion epsilon")
                ("max_iter", po::value<int>(&(Parameter::max_iter))->default_value(5), "number of iterations")
                ("max_inner_iter", po::value<int>(&(Parameter::max_inner_iter))->default_value(5), "number of inner iterations")
                ("node", po::value<int>(&(Parameter::num_of_machine))->default_value(1), "number of machines")
                ("thread", po::value<int>(&(Parameter::num_of_thread))->default_value(4), "number of thread per machine")
                ("data_folder", po::value<string>(&(Parameter::meta_path))->default_value("../data/netflix/"), "file path of data folder containing meta file")
                ("output_folder", po::value<string>(&(Parameter::output_path))->default_value("../output/netflix/"), "output folder path")
                ("output", po::value<bool>(&(Parameter::output))->default_value(true), "whether output row-wise latent vectors")
                ("verbose", po::value<bool>(&(Parameter::verbose))->default_value(true), "whether output information for debugging");

        po::variables_map vm;
        try {
            po::store(po::parse_command_line(argc, argv, desc), vm);
            po::notify(vm);
        } catch (std::exception &e) {
            cout << endl << e.what() << endl;
            cout << desc << endl;
            return 0;
        }

        if (vm.count("help")) {
            cout << desc << "\n";
            return false;
        } else {
            return true;
        }
    }